

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_coded_block_flag(bitstream *str,h264_cabac_context *cabac,int cat,int idx,uint32_t *val)

{
  int iVar1;
  int ctxIdx;
  int condTermFlagB;
  int condTermFlagA;
  int idxB;
  int idxA;
  h264_macroblock *mbB;
  h264_macroblock *mbA;
  int which;
  int inter;
  h264_macroblock *mbT;
  uint32_t *val_local;
  int idx_local;
  int cat_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  mbT = (h264_macroblock *)val;
  val_local._0_4_ = idx;
  val_local._4_4_ = cat;
  _idx_local = cabac;
  cabac_local = (h264_cabac_context *)str;
  _which = h264_mb_nb_p(cabac->slice,H264_MB_THIS,0);
  mbA._4_4_ = h264_is_inter_mb_type(_which->mb_type);
  switch(val_local._4_4_) {
  case 0:
  case 1:
  case 2:
  case 5:
    mbA._0_4_ = 0;
    break;
  case 3:
    mbA._0_4_ = (uint)val_local + 1;
    break;
  case 4:
    mbA._0_4_ = ((int)(uint)val_local >> 3) + 1;
    val_local._0_4_ = (uint)val_local & 7;
    break;
  case 6:
  case 7:
  case 8:
  case 9:
    mbA._0_4_ = 1;
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    mbA._0_4_ = 2;
    break;
  default:
    abort();
  }
  switch(val_local._4_4_) {
  case 0:
  case 3:
  case 6:
  case 10:
    mbB = h264_mb_nb(_idx_local->slice,H264_MB_A,mbA._4_4_);
    _idxB = h264_mb_nb(_idx_local->slice,H264_MB_B,mbA._4_4_);
    condTermFlagA = 0x10;
    condTermFlagB = 0x10;
    break;
  case 1:
  case 2:
  case 7:
  case 8:
  case 0xb:
  case 0xc:
    mbB = h264_mb_nb_b(_idx_local->slice,H264_MB_A,H264_BLOCK_4X4,mbA._4_4_,(uint)val_local,
                       &condTermFlagA);
    _idxB = h264_mb_nb_b(_idx_local->slice,H264_MB_B,H264_BLOCK_4X4,mbA._4_4_,(uint)val_local,
                         &condTermFlagB);
    break;
  case 4:
    mbB = h264_mb_nb_b(_idx_local->slice,H264_MB_A,H264_BLOCK_CHROMA,mbA._4_4_,(uint)val_local,
                       &condTermFlagA);
    _idxB = h264_mb_nb_b(_idx_local->slice,H264_MB_B,H264_BLOCK_CHROMA,mbA._4_4_,(uint)val_local,
                         &condTermFlagB);
    break;
  case 5:
  case 9:
  case 0xd:
    mbB = h264_mb_nb_b(_idx_local->slice,H264_MB_A,H264_BLOCK_8X8,mbA._4_4_,(uint)val_local,
                       &condTermFlagA);
    _idxB = h264_mb_nb_b(_idx_local->slice,H264_MB_B,H264_BLOCK_8X8,mbA._4_4_,(uint)val_local,
                         &condTermFlagB);
    condTermFlagA = condTermFlagA << 2;
    condTermFlagB = condTermFlagB << 2;
    if (((mbB->transform_size_8x8_flag == 0) && (mbB->mb_type != 0x19)) && (mbB->mb_type != 0x39)) {
      mbB = h264_mb_unavail(1);
    }
    if (((_idxB->transform_size_8x8_flag == 0) && (_idxB->mb_type != 0x19)) &&
       (_idxB->mb_type != 0x39)) {
      _idxB = h264_mb_unavail(1);
    }
    break;
  default:
    abort();
  }
  mbB = h264_inter_filter(_idx_local->slice,mbB,mbA._4_4_);
  _idxB = h264_inter_filter(_idx_local->slice,_idxB,mbA._4_4_);
  iVar1 = h264_cabac_decision((bitstream *)cabac_local,_idx_local,
                              h264_coded_block_flag::basectx[val_local._4_4_] +
                              mbB->coded_block_flag[(int)mbA][condTermFlagA] +
                              _idxB->coded_block_flag[(int)mbA][condTermFlagB] * 2,
                              &mbT->mb_field_decoding_flag);
  return iVar1;
}

Assistant:

int h264_coded_block_flag(struct bitstream *str, struct h264_cabac_context *cabac, int cat, int idx, uint32_t *val) {
	static const int basectx[14] = {
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT0,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT1,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT2,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT3,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT4,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT5,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT6,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT7,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT8,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT9,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT10,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT11,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT12,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT13,
	};
	const struct h264_macroblock *mbT = h264_mb_nb_p(cabac->slice, H264_MB_THIS, 0);
	int inter = h264_is_inter_mb_type(mbT->mb_type);
	int which;
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
		case H264_CTXBLOCKCAT_LUMA_8X8:
			which = 0;
			break;
		case H264_CTXBLOCKCAT_CB_DC:
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
		case H264_CTXBLOCKCAT_CB_8X8:
			which = 1;
			break;
		case H264_CTXBLOCKCAT_CR_DC:
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
		case H264_CTXBLOCKCAT_CR_8X8:
			which = 2;
			break;
		case H264_CTXBLOCKCAT_CHROMA_DC:
			which = idx + 1;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			which = (idx >> 3) + 1;
			idx &= 7;
			break;
		default:
			abort();
	}
	const struct h264_macroblock *mbA;
	const struct h264_macroblock *mbB;
	int idxA;
	int idxB;
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
		case H264_CTXBLOCKCAT_CB_DC:
		case H264_CTXBLOCKCAT_CR_DC:
		case H264_CTXBLOCKCAT_CHROMA_DC:
			mbA = h264_mb_nb(cabac->slice, H264_MB_A, inter);
			mbB = h264_mb_nb(cabac->slice, H264_MB_B, inter);
			idxA = 16;
			idxB = 16;
			break;
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_4X4, inter, idx, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_4X4, inter, idx, &idxB);
			break;
		case H264_CTXBLOCKCAT_LUMA_8X8:
		case H264_CTXBLOCKCAT_CB_8X8:
		case H264_CTXBLOCKCAT_CR_8X8:
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_8X8, inter, idx, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_8X8, inter, idx, &idxB);
			idxA *= 4;
			idxB *= 4;
			if (!mbA->transform_size_8x8_flag && mbA->mb_type != H264_MB_TYPE_I_PCM && mbA->mb_type != H264_MB_TYPE_UNAVAIL)
				mbA = h264_mb_unavail(1);;
			if (!mbB->transform_size_8x8_flag && mbB->mb_type != H264_MB_TYPE_I_PCM && mbB->mb_type != H264_MB_TYPE_UNAVAIL)
				mbB = h264_mb_unavail(1);;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_CHROMA, inter, idx, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_CHROMA, inter, idx, &idxB);
			break;
		default:
			abort();
	}
	mbA = h264_inter_filter(cabac->slice, mbA, inter);
	mbB = h264_inter_filter(cabac->slice, mbB, inter);
	int condTermFlagA = mbA->coded_block_flag[which][idxA];
	int condTermFlagB = mbB->coded_block_flag[which][idxB];
	int ctxIdx = basectx[cat] + condTermFlagA + condTermFlagB * 2;
	return h264_cabac_decision(str, cabac, ctxIdx, val);
}